

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.h
# Opt level: O3

bool __thiscall jbcoin::STAccount::isEquivalent(STAccount *this,STBase *t)

{
  long lVar1;
  
  if ((t->_vptr_STBase == (_func_int **)&PTR__STBase_002d2ef0) &&
     (this->default_ == (bool)*(char *)((long)&t[2]._vptr_STBase + 4))) {
    lVar1 = 0;
    do {
      if (*(char *)((long)(this->value_).pn + lVar1) != *(char *)((long)&t[1]._vptr_STBase + lVar1))
      {
        return lVar1 == 0x14;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x14);
    return true;
  }
  return false;
}

Assistant:

bool
    isEquivalent (const STBase& t) const override
    {
        auto const* const tPtr = dynamic_cast<STAccount const*>(&t);
        return tPtr && (default_ == tPtr->default_) && (value_ == tPtr->value_);
    }